

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

uint8_t matrix4_transformation_decompose_EXP
                  (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  (translation->field_0).v[0] = (self->field_0).m[3];
  (translation->field_0).v[1] = (self->field_0).m[7];
  (translation->field_0).v[2] = (self->field_0).m[0xb];
  dVar6 = (self->field_0).m[0];
  dVar1 = (self->field_0).m[4];
  dVar2 = (self->field_0).m[8];
  auVar3._8_8_ = -(ulong)((self->field_0).m[0xe] *
                          (self->field_0).m[10] * (self->field_0).m[6] * (self->field_0).m[2] < 0.0)
  ;
  auVar3._0_8_ = -(ulong)((self->field_0).m[0xd] *
                          (self->field_0).m[9] * (self->field_0).m[5] * (self->field_0).m[1] < 0.0);
  uVar4 = movmskpd(in_EAX,auVar3);
  dVar7 = SQRT(dVar2 * dVar2 + dVar6 * dVar6 + dVar1 * dVar1);
  uVar5 = -(ulong)(dVar6 * dVar1 * dVar2 * (self->field_0).m[0xc] < 0.0);
  (scale->field_0).v[0] = (double)((ulong)-dVar7 & uVar5 | ~uVar5 & (ulong)dVar7);
  dVar6 = SQRT((self->field_0).m[9] * (self->field_0).m[9] +
               (self->field_0).m[1] * (self->field_0).m[1] +
               (self->field_0).m[5] * (self->field_0).m[5]);
  if ((uVar4 & 1) != 0) {
    dVar6 = -dVar6;
  }
  (scale->field_0).v[1] = dVar6;
  dVar6 = SQRT((self->field_0).m[10] * (self->field_0).m[10] +
               (self->field_0).m[2] * (self->field_0).m[2] +
               (self->field_0).m[6] * (self->field_0).m[6]);
  if ((uVar4 & 2) != 0) {
    dVar6 = -dVar6;
  }
  (scale->field_0).v[2] = dVar6;
  (rotation->field_0).q[2] = 0.0;
  (rotation->field_0).q[0] = 0.0;
  (rotation->field_0).q[1] = 0.0;
  (rotation->field_0).q[3] = 1.0;
  return '\x01';
}

Assistant:

HYPAPI uint8_t matrix4_transformation_decompose_EXP(struct matrix4 *self, struct vector3 *scale, struct quaternion *rotation, struct vector3 *translation)
{
	HYP_FLOAT signx, signy, signz;

	/* translation */
	translation->x = self->c30;
	translation->y = self->c31;
	translation->z = self->c32;

	/*
	 * self->c00 = scale->x;
	 * self->c11 = scale->y;
	 * self->c22 = scale->z;
	 */

	/* sign */
	signx = ((self->c00 * self->c01 * self->c02 * self->c03) < 0) ? -1.0f : 1.0f;
	signy = ((self->c10 * self->c11 * self->c12 * self->c13) < 0) ? -1.0f : 1.0f;
	signz = ((self->c20 * self->c21 * self->c22 * self->c23) < 0) ? -1.0f : 1.0f;

	/* scale */
	scale->x = signx * HYP_SQRT(self->c00 * self->c00 + self->c01 * self->c01 + self->c02 * self->c02);
	scale->y = signy * HYP_SQRT(self->c10 * self->c10 + self->c11 * self->c11 + self->c12 * self->c12);
	scale->z = signz * HYP_SQRT(self->c20 * self->c20 + self->c21 * self->c21 + self->c22 * self->c22);

	/* todo */
	quaternion_identity(rotation);

	return 1;
}